

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

int zmq::do_setsockopt_int_as_bool_strict(void *optval_,size_t optvallen_,bool *out_value_)

{
  int iVar1;
  size_t in_RDX;
  void *in_RSI;
  int value;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  undefined4 local_4;
  
  iVar2 = -1;
  iVar1 = do_setsockopt<int>(in_RSI,in_RDX,(int *)CONCAT44(0xffffffff,in_stack_ffffffffffffffd8));
  if (iVar1 == -1) {
    local_4 = -1;
  }
  else if ((iVar2 == 0) || (iVar2 == 1)) {
    *(bool *)in_RDX = iVar2 != 0;
    local_4 = 0;
  }
  else {
    local_4 = sockopt_invalid();
  }
  return local_4;
}

Assistant:

int zmq::do_setsockopt_int_as_bool_strict (const void *const optval_,
                                           const size_t optvallen_,
                                           bool *const out_value_)
{
    // TODO handling of values other than 0 or 1 is not consistent,
    // here it is disallowed, but for other options such as
    // ZMQ_ROUTER_RAW any positive value is accepted
    int value = -1;
    if (do_setsockopt (optval_, optvallen_, &value) == -1)
        return -1;
    if (value == 0 || value == 1) {
        *out_value_ = (value != 0);
        return 0;
    }
    return sockopt_invalid ();
}